

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addEpochs<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  long lVar1;
  NetworkUpdateParameters *this;
  Int64Parameter *this_00;
  Int64Set *this_01;
  _Base_ptr p_Var2;
  Int64Range *this_02;
  _Rb_tree_header *p_Var3;
  int iVar4;
  int iVar5;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = this->epochs_;
  if (this_00 == (Int64Parameter *)0x0) {
    this_00 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this_00);
    this->epochs_ = this_00;
  }
  this_00->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (this_00->_oneof_case_[0] == 10) {
      this_02 = (this_00->AllowedValues_).range_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_00);
      this_00->_oneof_case_[0] = 10;
      this_02 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(this_02);
      (this_00->AllowedValues_).range_ = this_02;
    }
    this_02->minvalue_ = minValue;
    this_02->maxvalue_ = maxValue;
  }
  else {
    if (this_00->_oneof_case_[0] == 0xb) {
      this_01 = (this_00->AllowedValues_).set_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_00);
      this_00->_oneof_case_[0] = 0xb;
      this_01 = (Int64Set *)operator_new(0x28);
      CoreML::Specification::Int64Set::Int64Set(this_01);
      (this_00->AllowedValues_).set_ = this_01;
    }
    p_Var2 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      iVar4 = (this_01->values_).current_size_;
      do {
        lVar1 = *(long *)(p_Var2 + 1);
        iVar5 = iVar4;
        if (iVar4 == (this_01->values_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(&this_01->values_,iVar4 + 1);
          iVar5 = (this_01->values_).current_size_;
        }
        iVar4 = iVar5 + 1;
        (this_01->values_).current_size_ = iVar4;
        ((this_01->values_).rep_)->elements[iVar5] = lVar1;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

void addEpochs(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto epochs = updateParameters->mutable_epochs();
    
    epochs->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = epochs->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = epochs->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}